

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::~Transfer_Control_Request_PDU
          (Transfer_Control_Request_PDU *this)

{
  Transfer_Control_Request_PDU *this_local;
  
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transfer_Control_Request_PDU_00332030;
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::clear
            (&this->m_vRecs);
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::~vector
            (&this->m_vRecs);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_TrnsEntID);
  Simulation_Management_Header::~Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  return;
}

Assistant:

Transfer_Control_Request_PDU::~Transfer_Control_Request_PDU()
{
    m_vRecs.clear();
}